

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::EncodeLiteralInplace(cmGlobalNinjaGenerator *this,string *lit)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  allocator<char> local_91;
  string local_90;
  string local_70;
  pointer local_50;
  char *pcStack_48;
  char local_40 [32];
  
  cmsys::SystemTools::ReplaceString(lit,"$","$$");
  cmsys::SystemTools::ReplaceString(lit,"\n","$\n");
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x26])(this);
  if ((char)iVar1 != '\0') {
    pcStack_48 = local_40;
    local_50 = &DAT_00000001;
    local_40[0] = '$';
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x15])(this);
    local_90.field_2._M_allocated_capacity = strlen((char *)CONCAT44(extraout_var,iVar1));
    local_90._M_dataplus._M_p = local_50;
    local_90._M_string_length = (size_type)pcStack_48;
    views._M_len = 2;
    views._M_array = (iterator)&local_90;
    local_90.field_2._8_8_ = (char *)CONCAT44(extraout_var,iVar1);
    cmCatViews_abi_cxx11_(&local_70,views);
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x15])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,(char *)CONCAT44(extraout_var_00,iVar1),&local_91);
    cmsys::SystemTools::ReplaceString(lit,&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::EncodeLiteralInplace(std::string& lit)
{
  cmSystemTools::ReplaceString(lit, "$", "$$");
  cmSystemTools::ReplaceString(lit, "\n", "$\n");
  if (this->IsMultiConfig()) {
    cmSystemTools::ReplaceString(lit, cmStrCat('$', this->GetCMakeCFGIntDir()),
                                 this->GetCMakeCFGIntDir());
  }
}